

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLinearExpr<mp::internal::NullLinearExprHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           *this,int num_terms)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  if (0 < num_terms) {
    iVar1 = num_terms;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars);
    BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this->reader_);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}